

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O0

int ABC_AddGate(ABC_Manager mng,GateType type,char *name,int nofi,char **fanins,int dc_attr)

{
  Mem_Flex_t *p;
  int iVar1;
  size_t sVar2;
  char *__dest;
  int local_64;
  int i;
  char *pNewName;
  char *pSop;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  char **ppcStack_38;
  int dc_attr_local;
  char **fanins_local;
  char *pcStack_28;
  int nofi_local;
  char *name_local;
  ABC_Manager pAStack_18;
  GateType type_local;
  ABC_Manager mng_local;
  
  pFanin = (Abc_Obj_t *)0x0;
  pNewName = (char *)0x0;
  p = mng->pMmNames;
  pObj._4_4_ = dc_attr;
  ppcStack_38 = fanins;
  fanins_local._4_4_ = nofi;
  pcStack_28 = name;
  name_local._4_4_ = type;
  pAStack_18 = mng;
  sVar2 = strlen(name);
  __dest = Mem_FlexEntryFetch(p,(int)sVar2 + 1);
  strcpy(__dest,pcStack_28);
  pcStack_28 = __dest;
  if (name_local._4_4_ != CSAT_CONST) {
    if (name_local._4_4_ - CSAT_BPI < 2) {
      if (fanins_local._4_4_ != 0) {
        printf("ABC_AddGate: The PI/PPI gate \"%s\" has fanins.\n",__dest);
        return 0;
      }
      pFanin = Abc_NtkCreatePi(pAStack_18->pNtk);
      stmm_insert(pAStack_18->tNode2Name,(char *)pFanin,pcStack_28);
      goto LAB_0067077c;
    }
    if (7 < name_local._4_4_ - CSAT_BAND) {
      if (name_local._4_4_ - CSAT_BPPO < 2) {
        if (fanins_local._4_4_ != 1) {
          printf("ABC_AddGate: The PO/PPO gate \"%s\" does not have exactly one fanin.\n",__dest);
          return 0;
        }
        pFanin = Abc_NtkCreatePo(pAStack_18->pNtk);
        stmm_insert(pAStack_18->tNode2Name,(char *)pFanin,pcStack_28);
        iVar1 = stmm_lookup(pAStack_18->tName2Node,*ppcStack_38,&pSop);
        if (iVar1 == 0) {
          printf("ABC_AddGate: The fanin gate \"%s\" is not in the network.\n",*ppcStack_38);
          return 0;
        }
        Abc_ObjAddFanin(pFanin,(Abc_Obj_t *)pSop);
      }
      else {
        printf("ABC_AddGate: Unknown gate type.\n");
      }
      goto LAB_0067077c;
    }
  }
  pFanin = Abc_NtkCreateNode(pAStack_18->pNtk);
  for (local_64 = 0; local_64 < fanins_local._4_4_; local_64 = local_64 + 1) {
    iVar1 = stmm_lookup(pAStack_18->tName2Node,ppcStack_38[local_64],&pSop);
    if (iVar1 == 0) {
      printf("ABC_AddGate: The fanin gate \"%s\" is not in the network.\n",ppcStack_38[local_64]);
      return 0;
    }
    Abc_ObjAddFanin(pFanin,(Abc_Obj_t *)pSop);
  }
  switch(name_local._4_4_) {
  case CSAT_CONST:
    if (fanins_local._4_4_ != 0) {
      printf("ABC_AddGate: The constant gate \"%s\" has fanins.\n",pcStack_28);
      return 0;
    }
    pNewName = Abc_SopCreateConst1((Mem_Flex_t *)pAStack_18->pNtk->pManFunc);
    break;
  default:
    break;
  case CSAT_BAND:
    if (fanins_local._4_4_ < 1) {
      printf("ABC_AddGate: The AND gate \"%s\" no fanins.\n",pcStack_28);
      return 0;
    }
    pNewName = Abc_SopCreateAnd((Mem_Flex_t *)pAStack_18->pNtk->pManFunc,fanins_local._4_4_,
                                (int *)0x0);
    break;
  case CSAT_BNAND:
    if (fanins_local._4_4_ < 1) {
      printf("ABC_AddGate: The NAND gate \"%s\" no fanins.\n",pcStack_28);
      return 0;
    }
    pNewName = Abc_SopCreateNand((Mem_Flex_t *)pAStack_18->pNtk->pManFunc,fanins_local._4_4_);
    break;
  case CSAT_BOR:
    if (fanins_local._4_4_ < 1) {
      printf("ABC_AddGate: The OR gate \"%s\" no fanins.\n",pcStack_28);
      return 0;
    }
    pNewName = Abc_SopCreateOr((Mem_Flex_t *)pAStack_18->pNtk->pManFunc,fanins_local._4_4_,
                               (int *)0x0);
    break;
  case CSAT_BNOR:
    if (fanins_local._4_4_ < 1) {
      printf("ABC_AddGate: The NOR gate \"%s\" no fanins.\n",pcStack_28);
      return 0;
    }
    pNewName = Abc_SopCreateNor((Mem_Flex_t *)pAStack_18->pNtk->pManFunc,fanins_local._4_4_);
    break;
  case CSAT_BXOR:
    if (fanins_local._4_4_ < 1) {
      printf("ABC_AddGate: The XOR gate \"%s\" no fanins.\n",pcStack_28);
      return 0;
    }
    if (2 < fanins_local._4_4_) {
      printf("ABC_AddGate: The XOR gate \"%s\" has more than two fanins.\n",pcStack_28);
      return 0;
    }
    pNewName = Abc_SopCreateXor((Mem_Flex_t *)pAStack_18->pNtk->pManFunc,fanins_local._4_4_);
    break;
  case CSAT_BXNOR:
    if (fanins_local._4_4_ < 1) {
      printf("ABC_AddGate: The XNOR gate \"%s\" no fanins.\n",pcStack_28);
      return 0;
    }
    if (2 < fanins_local._4_4_) {
      printf("ABC_AddGate: The XNOR gate \"%s\" has more than two fanins.\n",pcStack_28);
      return 0;
    }
    pNewName = Abc_SopCreateNxor((Mem_Flex_t *)pAStack_18->pNtk->pManFunc,fanins_local._4_4_);
    break;
  case CSAT_BINV:
    if (fanins_local._4_4_ != 1) {
      printf("ABC_AddGate: The inverter gate \"%s\" does not have exactly one fanin.\n",pcStack_28);
      return 0;
    }
    pNewName = Abc_SopCreateInv((Mem_Flex_t *)pAStack_18->pNtk->pManFunc);
    break;
  case CSAT_BBUF:
    if (fanins_local._4_4_ != 1) {
      printf("ABC_AddGate: The buffer gate \"%s\" does not have exactly one fanin.\n",pcStack_28);
      return 0;
    }
    pNewName = Abc_SopCreateBuf((Mem_Flex_t *)pAStack_18->pNtk->pManFunc);
  }
  Abc_ObjSetData(pFanin,pNewName);
LAB_0067077c:
  iVar1 = stmm_insert(pAStack_18->tName2Node,pcStack_28,(char *)pFanin);
  if (iVar1 != 0) {
    printf("ABC_AddGate: The same gate \"%s\" is added twice.\n",pcStack_28);
  }
  mng_local._4_4_ = (uint)(iVar1 == 0);
  return mng_local._4_4_;
}

Assistant:

int ABC_AddGate( ABC_Manager mng, enum GateType type, char * name, int nofi, char ** fanins, int dc_attr )
{
    Abc_Obj_t * pObj = NULL; // Suppress "might be used uninitialized"
    Abc_Obj_t * pFanin;
    char * pSop = NULL; // Suppress "might be used uninitialized"
    char * pNewName;
    int i;

    // save the name in the local memory manager
    pNewName = Mem_FlexEntryFetch( mng->pMmNames, strlen(name) + 1 );
    strcpy( pNewName, name );
    name = pNewName;

    // consider different cases, create the node, and map the node into the name
    switch( type )
    {
    case CSAT_BPI:
    case CSAT_BPPI:
        if ( nofi != 0 )
            { printf( "ABC_AddGate: The PI/PPI gate \"%s\" has fanins.\n", name ); return 0; }
        // create the PI
        pObj = Abc_NtkCreatePi( mng->pNtk );
        stmm_insert( mng->tNode2Name, (char *)pObj, name );
        break;
    case CSAT_CONST:
    case CSAT_BAND:
    case CSAT_BNAND:
    case CSAT_BOR:
    case CSAT_BNOR:
    case CSAT_BXOR:
    case CSAT_BXNOR:
    case CSAT_BINV:
    case CSAT_BBUF:
        // create the node
        pObj = Abc_NtkCreateNode( mng->pNtk );
        // create the fanins
        for ( i = 0; i < nofi; i++ )
        {
            if ( !stmm_lookup( mng->tName2Node, fanins[i], (char **)&pFanin ) )
                { printf( "ABC_AddGate: The fanin gate \"%s\" is not in the network.\n", fanins[i] ); return 0; }
            Abc_ObjAddFanin( pObj, pFanin );
        }
        // create the node function
        switch( type )
        {
            case CSAT_CONST:
                if ( nofi != 0 )
                    { printf( "ABC_AddGate: The constant gate \"%s\" has fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateConst1( (Mem_Flex_t *)mng->pNtk->pManFunc );
                break;
            case CSAT_BAND:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The AND gate \"%s\" no fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateAnd( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi, NULL );
                break;
            case CSAT_BNAND:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The NAND gate \"%s\" no fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateNand( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi );
                break;
            case CSAT_BOR:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The OR gate \"%s\" no fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateOr( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi, NULL );
                break;
            case CSAT_BNOR:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The NOR gate \"%s\" no fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateNor( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi );
                break;
            case CSAT_BXOR:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The XOR gate \"%s\" no fanins.\n", name ); return 0; }
                if ( nofi > 2 )
                    { printf( "ABC_AddGate: The XOR gate \"%s\" has more than two fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateXor( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi );
                break;
            case CSAT_BXNOR:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The XNOR gate \"%s\" no fanins.\n", name ); return 0; }
                if ( nofi > 2 )
                    { printf( "ABC_AddGate: The XNOR gate \"%s\" has more than two fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateNxor( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi );
                break;
            case CSAT_BINV:
                if ( nofi != 1 )
                    { printf( "ABC_AddGate: The inverter gate \"%s\" does not have exactly one fanin.\n", name ); return 0; }
                pSop = Abc_SopCreateInv( (Mem_Flex_t *)mng->pNtk->pManFunc );
                break;
            case CSAT_BBUF:
                if ( nofi != 1 )
                    { printf( "ABC_AddGate: The buffer gate \"%s\" does not have exactly one fanin.\n", name ); return 0; }
                pSop = Abc_SopCreateBuf( (Mem_Flex_t *)mng->pNtk->pManFunc );
                break;
            default :
                break;
        }
        Abc_ObjSetData( pObj, pSop );
        break;
    case CSAT_BPPO:
    case CSAT_BPO:
        if ( nofi != 1 )
            { printf( "ABC_AddGate: The PO/PPO gate \"%s\" does not have exactly one fanin.\n", name ); return 0; }
        // create the PO
        pObj = Abc_NtkCreatePo( mng->pNtk );
        stmm_insert( mng->tNode2Name, (char *)pObj, name );
        // connect to the PO fanin
        if ( !stmm_lookup( mng->tName2Node, fanins[0], (char **)&pFanin ) )
            { printf( "ABC_AddGate: The fanin gate \"%s\" is not in the network.\n", fanins[0] ); return 0; }
        Abc_ObjAddFanin( pObj, pFanin );
        break;
    default:
        printf( "ABC_AddGate: Unknown gate type.\n" );
        break;
    }

    // map the name into the node
    if ( stmm_insert( mng->tName2Node, name, (char *)pObj ) )
        { printf( "ABC_AddGate: The same gate \"%s\" is added twice.\n", name ); return 0; }
    return 1;
}